

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eccommit_impl.h
# Opt level: O0

int secp256k1_ec_commit_pubkey_serialize_const(secp256k1_ge *pubp,uchar *buf33)

{
  undefined1 uVar1;
  int iVar2;
  secp256k1_fe *in_RSI;
  uchar *in_RDI;
  int local_4;
  
  iVar2 = secp256k1_ge_is_infinity((secp256k1_ge *)0x111fc7);
  if (iVar2 == 0) {
    secp256k1_fe_normalize((secp256k1_fe *)0x111fe0);
    secp256k1_fe_normalize((secp256k1_fe *)0x111fee);
    secp256k1_fe_get_b32(in_RDI,in_RSI);
    iVar2 = secp256k1_fe_is_odd((secp256k1_fe *)0x11200e);
    uVar1 = 2;
    if (iVar2 != 0) {
      uVar1 = 3;
    }
    *(undefined1 *)in_RSI->n = uVar1;
    local_4 = 1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int secp256k1_ec_commit_pubkey_serialize_const(secp256k1_ge *pubp, unsigned char *buf33) {
    if (secp256k1_ge_is_infinity(pubp)) {
        return 0;
    }
    secp256k1_fe_normalize(&pubp->x);
    secp256k1_fe_normalize(&pubp->y);
    secp256k1_fe_get_b32(&buf33[1], &pubp->x);
    buf33[0] = secp256k1_fe_is_odd(&pubp->y) ? SECP256K1_TAG_PUBKEY_ODD : SECP256K1_TAG_PUBKEY_EVEN;
    return 1;
}